

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::COMBICState::Decode(COMBICState *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  COMBICState *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x40) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_EnvironmentRecord).m_ui16Length);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_EnvironmentRecord).m_ui8Index);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_EnvironmentRecord).m_ui8Padding);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32TSC);
  pKVar2 = operator>>(pKVar2,&(this->m_MunSrc).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32NumSrcs);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16GeometryIndex);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32SrcType);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32BarrageRate);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32BarrageDuration);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32BarrageCrosswindLength);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32BarrageDownwindLength);
  pKVar2 = operator>>(pKVar2,&(this->m_DetVel).super_DataTypeBase);
  KDataStream::operator>>(pKVar2,&this->m_ui32Padding);
  return;
}

Assistant:

void COMBICState::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < COMBIC_STATE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> m_ui32TSC
           >> KDIS_STREAM m_MunSrc
           >> m_ui32NumSrcs
           >> m_ui16GeometryIndex
           >> m_ui16Padding
           >> m_ui32SrcType
           >> m_f32BarrageRate
           >> m_f32BarrageDuration
           >> m_f32BarrageCrosswindLength
           >> m_f32BarrageDownwindLength
           >> KDIS_STREAM m_DetVel
           >> m_ui32Padding;
}